

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::DirectiveSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if (((((((kind == BeginKeywordsDirective) || (kind == CellDefineDirective)) ||
         (kind == DefaultNetTypeDirective)) ||
        ((kind == DefineDirective || (kind == ElsIfDirective)))) ||
       ((kind == ElseDirective || ((kind - EndCellDefineDirective < 3 || (kind == IfDefDirective))))
       )) || (kind == IfNDefDirective)) ||
     ((((kind == IncludeDirective || (kind == LineDirective)) || (kind == MacroUsage)) ||
      (((kind == NoUnconnectedDriveDirective || (kind == PragmaDirective)) ||
       ((kind == ResetAllDirective ||
        ((kind == TimeScaleDirective || (kind - UnconnectedDriveDirective < 3)))))))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool DirectiveSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BeginKeywordsDirective:
        case SyntaxKind::CellDefineDirective:
        case SyntaxKind::DefaultNetTypeDirective:
        case SyntaxKind::DefineDirective:
        case SyntaxKind::ElsIfDirective:
        case SyntaxKind::ElseDirective:
        case SyntaxKind::EndCellDefineDirective:
        case SyntaxKind::EndIfDirective:
        case SyntaxKind::EndKeywordsDirective:
        case SyntaxKind::IfDefDirective:
        case SyntaxKind::IfNDefDirective:
        case SyntaxKind::IncludeDirective:
        case SyntaxKind::LineDirective:
        case SyntaxKind::MacroUsage:
        case SyntaxKind::NoUnconnectedDriveDirective:
        case SyntaxKind::PragmaDirective:
        case SyntaxKind::ResetAllDirective:
        case SyntaxKind::TimeScaleDirective:
        case SyntaxKind::UnconnectedDriveDirective:
        case SyntaxKind::UndefDirective:
        case SyntaxKind::UndefineAllDirective:
            return true;
        default:
            return false;
    }
}